

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O1

int __thiscall
zmq::ip_resolver_t::resolve_getaddrinfo(ip_resolver_t *this,ip_addr_t *ip_addr_,char *addr_)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  addrinfo *res;
  addrinfo req;
  long local_50;
  ulong local_48 [6];
  
  local_50 = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  bVar1 = (this->_options)._ipv6_wanted;
  local_48[1] = 1;
  bVar2 = (this->_options)._bindable_wanted;
  local_48[0] = CONCAT44((uint)bVar1 * 8 + 2,(uint)bVar2);
  if ((this->_options)._dns_allowed == false) {
    local_48[0]._1_7_ = (undefined7)(local_48[0] >> 8);
    local_48[0] = CONCAT71(local_48[0]._1_7_,bVar2) | 4;
  }
  if (bVar1 != false) {
    local_48[0] = local_48[0] | 8;
  }
  iVar4 = (*this->_vptr_ip_resolver_t[2])(this,addr_,0,local_48,&local_50);
  if (iVar4 == -1) {
    iVar4 = -1;
    if ((local_48[0] & 8) != 0) {
      local_48[0] = local_48[0] & 0xfffffffffffffff7;
      iVar4 = (*this->_vptr_ip_resolver_t[2])(this,addr_,0,local_48,&local_50);
    }
  }
  if (iVar4 == 0) {
    if (local_50 == 0) {
      resolve_getaddrinfo();
    }
    if (0x1c < *(uint *)(local_50 + 0x10)) {
      resolve_getaddrinfo();
    }
    lVar3 = local_50;
    memcpy(ip_addr_,*(void **)(local_50 + 0x18),(ulong)*(uint *)(local_50 + 0x10));
    (*this->_vptr_ip_resolver_t[3])(this,lVar3);
    iVar4 = 0;
  }
  else {
    if (iVar4 == -10) {
      piVar5 = __errno_location();
      *piVar5 = 0xc;
    }
    else {
      bVar1 = (this->_options)._bindable_wanted;
      piVar5 = __errno_location();
      if (bVar1 == true) {
        *piVar5 = 0x13;
      }
      else {
        *piVar5 = 0x16;
      }
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int zmq::ip_resolver_t::resolve_getaddrinfo (ip_addr_t *ip_addr_,
                                             const char *addr_)
{
#if defined ZMQ_HAVE_OPENVMS && defined __ia64
    __addrinfo64 *res = NULL;
    __addrinfo64 req;
#else
    addrinfo *res = NULL;
    addrinfo req;
#endif

    memset (&req, 0, sizeof (req));

    //  Choose IPv4 or IPv6 protocol family. Note that IPv6 allows for
    //  IPv4-in-IPv6 addresses.
    req.ai_family = _options.ipv6 () ? AF_INET6 : AF_INET;

    //  Arbitrary, not used in the output, but avoids duplicate results.
    req.ai_socktype = SOCK_STREAM;

    req.ai_flags = 0;

    if (_options.bindable ()) {
        req.ai_flags |= AI_PASSIVE;
    }

    if (!_options.allow_dns ()) {
        req.ai_flags |= AI_NUMERICHOST;
    }

#if defined AI_V4MAPPED
    //  In this API we only require IPv4-mapped addresses when
    //  no native IPv6 interfaces are available (~AI_ALL).
    //  This saves an additional DNS roundtrip for IPv4 addresses.
    if (req.ai_family == AF_INET6) {
        req.ai_flags |= AI_V4MAPPED;
    }
#endif

    //  Resolve the literal address. Some of the error info is lost in case
    //  of error, however, there's no way to report EAI errors via errno.
    int rc = do_getaddrinfo (addr_, NULL, &req, &res);

#if defined AI_V4MAPPED
    // Some OS do have AI_V4MAPPED defined but it is not supported in getaddrinfo()
    // returning EAI_BADFLAGS. Detect this and retry
    if (rc == EAI_BADFLAGS && (req.ai_flags & AI_V4MAPPED)) {
        req.ai_flags &= ~AI_V4MAPPED;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

#if defined ZMQ_HAVE_WINDOWS
    //  Resolve specific case on Windows platform when using IPv4 address
    //  with ZMQ_IPv6 socket option.
    if ((req.ai_family == AF_INET6) && (rc == WSAHOST_NOT_FOUND)) {
        req.ai_family = AF_INET;
        rc = do_getaddrinfo (addr_, NULL, &req, &res);
    }
#endif

    if (rc) {
        switch (rc) {
            case EAI_MEMORY:
                errno = ENOMEM;
                break;
            default:
                if (_options.bindable ()) {
                    errno = ENODEV;
                } else {
                    errno = EINVAL;
                }
                break;
        }
        return -1;
    }

    //  Use the first result.
    zmq_assert (res != NULL);
    zmq_assert (static_cast<size_t> (res->ai_addrlen) <= sizeof (*ip_addr_));
    memcpy (ip_addr_, res->ai_addr, res->ai_addrlen);

    //  Cleanup getaddrinfo after copying the possibly referenced result.
    do_freeaddrinfo (res);

    return 0;
}